

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O0

int main(int argc,char **argv)

{
  nk_rect bounds;
  nk_font_atlas *pnVar1;
  int iVar2;
  nk_color nVar3;
  GLFWmonitor *handle;
  GLFWgammaramp *pGVar4;
  size_t __size;
  nk_rect bounds_00;
  GLFWgammaramp *ramp_1;
  nk_rect area;
  int height;
  int width;
  size_t array_size;
  GLFWgammaramp *ramp;
  float gamma_value;
  nk_font_atlas *atlas;
  nk_context *nk;
  GLFWgammaramp orig_ramp;
  GLFWwindow *window;
  GLFWmonitor *monitor;
  char **argv_local;
  int argc_local;
  
  ramp._4_4_ = 1.0;
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  handle = glfwGetPrimaryMonitor();
  orig_ramp._24_8_ = glfwCreateWindow(800,400,"Gamma Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if ((GLFWwindow *)orig_ramp._24_8_ == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  pGVar4 = glfwGetGammaRamp(handle);
  __size = (ulong)pGVar4->size << 1;
  orig_ramp.blue._0_4_ = pGVar4->size;
  nk = (nk_context *)malloc(__size);
  orig_ramp.red = (unsigned_short *)malloc(__size);
  orig_ramp.green = (unsigned_short *)malloc(__size);
  memcpy(nk,pGVar4->red,__size);
  memcpy(orig_ramp.red,pGVar4->green,__size);
  memcpy(orig_ramp.green,pGVar4->blue,__size);
  glfwMakeContextCurrent((GLFWwindow *)orig_ramp._24_8_);
  gladLoadGLLoader(glfwGetProcAddress);
  glfwSwapInterval(1);
  atlas = (nk_font_atlas *)nk_glfw3_init((GLFWwindow *)orig_ramp._24_8_,NK_GLFW3_INSTALL_CALLBACKS);
  nk_glfw3_font_stash_begin((nk_font_atlas **)&stack0xffffffffffffffa8);
  nk_glfw3_font_stash_end();
  glfwSetKeyCallback((GLFWwindow *)orig_ramp._24_8_,key_callback);
  while( true ) {
    iVar2 = glfwWindowShouldClose((GLFWwindow *)orig_ramp._24_8_);
    if (iVar2 != 0) break;
    glfwGetWindowSize((GLFWwindow *)orig_ramp._24_8_,(int *)&area.h,(int *)&area.w);
    bounds_00 = nk_rect(0.0,0.0,(float)(int)area.h,(float)(int)area.w);
    area._0_8_ = bounds_00._8_8_;
    nk_window_set_bounds((nk_context *)atlas,"",bounds_00);
    (*glad_glClear)(0x4000);
    nk_glfw3_new_frame();
    bounds.w = area.x;
    bounds.h = area.y;
    bounds.x = (float)(int)bounds_00._0_8_;
    bounds.y = (float)(int)((ulong)bounds_00._0_8_ >> 0x20);
    iVar2 = nk_begin((nk_context *)atlas,"",bounds,0);
    if (iVar2 != 0) {
      nk_layout_row_dynamic((nk_context *)atlas,30.0,3);
      iVar2 = nk_slider_float((nk_context *)atlas,0.1,(float *)((long)&ramp + 4),5.0,0.1);
      if (iVar2 != 0) {
        glfwSetGamma(handle,ramp._4_4_);
      }
      nk_labelf((nk_context *)atlas,0x11,"%0.1f",SUB84((double)ramp._4_4_,0));
      iVar2 = nk_button_label((nk_context *)atlas,"Revert");
      if (iVar2 != 0) {
        glfwSetGammaRamp(handle,(GLFWgammaramp *)&nk);
      }
      pGVar4 = glfwGetGammaRamp(handle);
      nk_layout_row_dynamic((nk_context *)atlas,(float)(int)area.w - 60.0,3);
      pnVar1 = atlas;
      nVar3 = nk_rgb(0xff,0,0);
      chart_ramp_array((nk_context *)pnVar1,nVar3,pGVar4->size,pGVar4->red);
      pnVar1 = atlas;
      nVar3 = nk_rgb(0,0xff,0);
      chart_ramp_array((nk_context *)pnVar1,nVar3,pGVar4->size,pGVar4->green);
      pnVar1 = atlas;
      nVar3 = nk_rgb(0,0,0xff);
      chart_ramp_array((nk_context *)pnVar1,nVar3,pGVar4->size,pGVar4->blue);
    }
    nk_end((nk_context *)atlas);
    nk_glfw3_render(NK_ANTI_ALIASING_ON);
    glfwSwapBuffers((GLFWwindow *)orig_ramp._24_8_);
    glfwWaitEventsTimeout(1.0);
  }
  free(nk);
  free(orig_ramp.red);
  free(orig_ramp.green);
  nk_glfw3_shutdown();
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    GLFWgammaramp orig_ramp;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;
    float gamma_value = 1.f;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitor = glfwGetPrimaryMonitor();

    window = glfwCreateWindow(800, 400, "Gamma Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    {
        const GLFWgammaramp* ramp = glfwGetGammaRamp(monitor);
        const size_t array_size = ramp->size * sizeof(short);
        orig_ramp.size = ramp->size;
        orig_ramp.red = malloc(array_size);
        orig_ramp.green = malloc(array_size);
        orig_ramp.blue = malloc(array_size);
        memcpy(orig_ramp.red, ramp->red, array_size);
        memcpy(orig_ramp.green, ramp->green, array_size);
        memcpy(orig_ramp.blue, ramp->blue, array_size);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);
        nk_window_set_bounds(nk, "", area);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            const GLFWgammaramp* ramp;

            nk_layout_row_dynamic(nk, 30, 3);
            if (nk_slider_float(nk, 0.1f, &gamma_value, 5.f, 0.1f))
                glfwSetGamma(monitor, gamma_value);
            nk_labelf(nk, NK_TEXT_LEFT, "%0.1f", gamma_value);
            if (nk_button_label(nk, "Revert"))
                glfwSetGammaRamp(monitor, &orig_ramp);

            ramp = glfwGetGammaRamp(monitor);

            nk_layout_row_dynamic(nk, height - 60.f, 3);
            chart_ramp_array(nk, nk_rgb(255, 0, 0), ramp->size, ramp->red);
            chart_ramp_array(nk, nk_rgb(0, 255, 0), ramp->size, ramp->green);
            chart_ramp_array(nk, nk_rgb(0, 0, 255), ramp->size, ramp->blue);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwWaitEventsTimeout(1.0);
    }

    free(orig_ramp.red);
    free(orig_ramp.green);
    free(orig_ramp.blue);

    nk_glfw3_shutdown();
    glfwTerminate();
    exit(EXIT_SUCCESS);
}